

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::StopCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  Output *this_00;
  Output local_38 [3];
  Output local_20;
  char *local_18;
  char *params_local;
  UCIAdapter *this_local;
  
  local_18 = params;
  params_local = (char *)this;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&local_18);
  if (bVar1) {
    Output::Output(&local_20,InfoPrefix);
    this_00 = Output::operator<<(&local_20,(char (*) [8])"usage: ");
    Output::operator<<(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               token::Stop_abi_cxx11_);
    Output::~Output(&local_20);
    Output::Output(local_38,InfoPrefix);
    Output::operator<<(local_38,(char (*) [34])"Stop engine if it is calculating.");
    Output::~Output(local_38);
  }
  else {
    ChessEngine::Stop(this->engine,FullStop);
    Thread::Join(&this->thread);
  }
  return;
}

Assistant:

void UCIAdapter::StopCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Stop;
    Output() << "Stop engine if it is calculating.";
    return;
  }

  engine->Stop(ChessEngine::FullStop);
  thread.Join();
}